

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

void __thiscall
transwarp::value_task<bool>::value_task<bool_const&>
          (value_task<bool> *this,bool has_name,string *name,bool *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar4;
  node *__p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38;
  (this->super_enable_shared_from_this<transwarp::value_task<bool>_>)._M_weak_this.
  super___weak_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2> =
       (__weak_ptr<transwarp::value_task<bool>,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->super_task<bool>).super_itask._vptr_itask = (_func_int **)&PTR__value_task_001eb6e0;
  __p = (node *)operator_new(0x80);
  __p->id_ = 0;
  __p->level_ = 0;
  __p->type_ = root;
  (__p->name_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  (__p->executor_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          )0x0;
  (__p->parents_).
  super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->parents_).
  super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(__p->parents_).
    super__Vector_base<std::shared_ptr<transwarp::node>,_std::allocator<std::shared_ptr<transwarp::node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (__p->custom_data_).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (__p->canceled_)._M_base._M_i = false;
  *(undefined4 *)&(__p->avg_waittime_us_).super___atomic_base<long>._M_i = 0xffffffff;
  *(undefined4 *)((long)&(__p->avg_waittime_us_).super___atomic_base<long>._M_i + 4) = 0xffffffff;
  *(undefined4 *)&(__p->avg_runtime_us_).super___atomic_base<long>._M_i = 0xffffffff;
  *(undefined4 *)((long)&(__p->avg_runtime_us_).super___atomic_base<long>._M_i + 4) = 0xffffffff;
  (this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<transwarp::node*>
            (&(this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  detail::make_future_with_value<bool,bool_const&>((detail *)&this->future_,value);
  this->visited_ = false;
  peVar2 = (this->node_).super___shared_ptr<transwarp::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2->type_ = root;
  if (has_name) {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
    pcVar3 = (name->_M_dataplus)._M_p;
    paVar1 = &name->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 == paVar1) {
      uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
      (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
      *(undefined8 *)((long)&local_38->field_2 + 8) = uVar4;
    }
    else {
      (local_38->_M_dataplus)._M_p = pcVar3;
      (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    }
    local_38->_M_string_length = name->_M_string_length;
    (name->_M_dataplus)._M_p = (pointer)paVar1;
    name->_M_string_length = 0;
    (name->field_2)._M_local_buf[0] = '\0';
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::__cxx11::string*>
              (&_Stack_30,local_38);
  }
  else {
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  this_00 = (peVar2->name_).
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (peVar2->name_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_38;
  (peVar2->name_).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Stack_30._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

value_task(bool has_name, std::string name, T&& value)
    : node_(new transwarp::node),
      future_(transwarp::detail::make_future_with_value<result_type>(std::forward<T>(value)))
    {
        transwarp::detail::node_manip::set_type(*node_, task_type::value);
        transwarp::detail::node_manip::set_name(*node_, (has_name ? std::shared_ptr<std::string>(new std::string(std::move(name))) : nullptr));
    }